

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_player_prop_code(parser *p)

{
  int iVar1;
  char *code_00;
  void *pvVar2;
  int local_2c;
  wchar_t index;
  embryo_player_ability *embryo;
  char *code;
  parser *p_local;
  
  code_00 = parser_getstr(p,"code");
  pvVar2 = parser_priv(p);
  local_2c = -1;
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(long *)((long)pvVar2 + 0x10) == 0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_PLAY_PROP_TYPE;
  }
  else {
    iVar1 = strcmp(*(char **)((long)pvVar2 + 0x10),"player");
    if (iVar1 == 0) {
      local_2c = code_index_in_array(player_info_flags,code_00);
    }
    else {
      iVar1 = strcmp(*(char **)((long)pvVar2 + 0x10),"object");
      if (iVar1 == 0) {
        local_2c = code_index_in_array(list_obj_flag_names,code_00);
      }
    }
    if (local_2c < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_PLAY_PROP_CODE;
    }
    else {
      *(short *)((long)pvVar2 + 8) = (short)local_2c;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_player_prop_code(struct parser *p) {
	const char *code = parser_getstr(p, "code");
	struct embryo_player_ability *embryo = parser_priv(p);
	int index = -1;

	if (!embryo)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!embryo->ability.type)
		return PARSE_ERROR_MISSING_PLAY_PROP_TYPE;

	if (streq(embryo->ability.type, "player")) {
		index = code_index_in_array(player_info_flags, code);
	} else if (streq(embryo->ability.type, "object")) {
		index = code_index_in_array(list_obj_flag_names, code);
	}
	if (index >= 0) {
		embryo->ability.index = index;
	} else {
		return PARSE_ERROR_INVALID_PLAY_PROP_CODE;
	}
	return PARSE_ERROR_NONE;
}